

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObject::killTimer(QObject *this,TimerId id)

{
  bool bVar1;
  uint uVar2;
  QObjectPrivate *pQVar3;
  QThread *pQVar4;
  QThread *pQVar5;
  qsizetype qVar6;
  char *pcVar7;
  ushort *puVar8;
  TimerId in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  Type thisThreadData;
  int at;
  QObjectPrivate *d;
  QMetaObject *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  TimerId in_stack_ffffffffffffff24;
  QAbstractEventDispatcher *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int local_b0;
  QString local_68;
  QMessageLogger local_50;
  QMessageLogger local_30;
  TimerId local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  pQVar3 = d_func((QObject *)0x3ee997);
  pQVar4 = thread((QObject *)0x3ee9a6);
  pQVar5 = QThread::currentThread();
  if (pQVar4 == pQVar5) {
    if (0 < (int)local_c) {
      if (pQVar3->extraData == (ExtraData *)0x0) {
        local_b0 = -1;
      }
      else {
        qVar6 = QListSpecialMethodsBase<Qt::TimerId>::indexOf<Qt::TimerId>
                          ((QListSpecialMethodsBase<Qt::TimerId> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (TimerId *)in_stack_ffffffffffffff28,
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        local_b0 = (int)qVar6;
      }
      if (local_b0 == -1) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                   (char *)in_stack_ffffffffffffff18);
        uVar2 = qToUnderlying<Qt::TimerId>(local_c);
        (**in_RDI->_vptr_QObject)();
        pcVar7 = QMetaObject::className(in_stack_ffffffffffffff18);
        objectName(in_RDI);
        QtPrivate::asString(&local_68);
        puVar8 = QString::utf16((QString *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        QMessageLogger::warning
                  (&local_50,
                   "QObject::killTimer(): Error: timer id %d is not valid for object %p (%s, %ls), timer has not been killed"
                   ,(ulong)uVar2,in_RDI,pcVar7,puVar8);
        QString::~QString((QString *)0x3eeb09);
      }
      else {
        QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x3eeb40);
        bVar1 = QThreadData::hasEventDispatcher((QThreadData *)0x3eeb4f);
        if (bVar1) {
          QBasicAtomicPointer<QAbstractEventDispatcher>::loadRelaxed
                    ((QBasicAtomicPointer<QAbstractEventDispatcher> *)0x3eeb63);
          QAbstractEventDispatcher::unregisterTimer
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
        }
        QList<Qt::TimerId>::remove(&pQVar3->extraData->runningTimers,(char *)(long)local_b0);
        QAbstractEventDispatcherPrivate::releaseTimerId(Invalid);
      }
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
               (char *)in_stack_ffffffffffffff18);
    QMessageLogger::warning
              (&local_30,"QObject::killTimer: Timers cannot be stopped from another thread");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QObject::killTimer(Qt::TimerId id)
{
    Q_D(QObject);
    if (Q_UNLIKELY(thread() != QThread::currentThread())) {
        qWarning("QObject::killTimer: Timers cannot be stopped from another thread");
        return;
    }
    if (id > Qt::TimerId::Invalid) {
        int at = d->extraData ? d->extraData->runningTimers.indexOf(id) : -1;
        if (at == -1) {
            // timer isn't owned by this object
            qWarning("QObject::killTimer(): Error: timer id %d is not valid for object %p (%s, %ls), timer has not been killed",
                     qToUnderlying(id),
                     this,
                     metaObject()->className(),
                     qUtf16Printable(objectName()));
            return;
        }

        auto thisThreadData = d->threadData.loadRelaxed();
        if (thisThreadData->hasEventDispatcher())
            thisThreadData->eventDispatcher.loadRelaxed()->unregisterTimer(id);

        d->extraData->runningTimers.remove(at);
        QAbstractEventDispatcherPrivate::releaseTimerId(id);
    }
}